

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

int __thiscall QToolBarAreaLayoutInfo::distance(QToolBarAreaLayoutInfo *this,QPoint *pos)

{
  int iVar1;
  
  iVar1 = -1;
  switch(this->dockPos) {
  case LeftDock:
    if ((pos->yp).m_i < (this->rect).y2.m_i) {
      return (pos->xp).m_i - (this->rect).x2.m_i;
    }
    break;
  case RightDock:
    if ((pos->yp).m_i < (this->rect).y2.m_i) {
      return (this->rect).x1.m_i - (pos->xp).m_i;
    }
    break;
  case TopDock:
    if ((pos->xp).m_i < (this->rect).x2.m_i) {
      return (pos->yp).m_i - (this->rect).y2.m_i;
    }
    break;
  case BottomDock:
    if ((pos->xp).m_i < (this->rect).x2.m_i) {
      iVar1 = (this->rect).y1.m_i - (pos->yp).m_i;
    }
  }
  return iVar1;
}

Assistant:

int QToolBarAreaLayoutInfo::distance(const QPoint &pos) const
{
    switch (dockPos) {
        case QInternal::LeftDock:
            if (pos.y() < rect.bottom())
                return pos.x() - rect.right();
            break;
        case QInternal::RightDock:
            if (pos.y() < rect.bottom())
                return rect.left() - pos.x();
            break;
        case QInternal::TopDock:
            if (pos.x() < rect.right())
                return pos.y() - rect.bottom();
            break;
        case QInternal::BottomDock:
            if (pos.x() < rect.right())
                return rect.top() - pos.y();
            break;

        case QInternal::DockCount:
            break;
    }
    return -1;
}